

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O3

void __thiscall QSplitterHandle::mouseMoveEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  QWidget *this_00;
  QSplitter *this_01;
  Representation RVar2;
  bool bVar3;
  QPoint QVar4;
  int iVar5;
  long in_FS_OFFSET;
  double dVar6;
  undefined1 auVar7 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(byte *)(lVar1 + 0x268) & 4) != 0) {
    this_00 = *(QWidget **)(lVar1 + 0x10);
    auVar7 = QEventPoint::globalPosition();
    dVar6 = (double)((ulong)auVar7._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._0_8_;
    bVar3 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar6);
    dVar6 = (double)((ulong)auVar7._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar7._8_8_;
    bVar3 = 2147483647.0 < dVar6;
    if (dVar6 <= -2147483648.0) {
      dVar6 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar6);
    QVar4 = QWidget::mapFromGlobal(this_00,&local_28);
    RVar2 = QVar4.yp.m_i;
    if (*(int *)(lVar1 + 0x260) == 1) {
      RVar2 = QVar4.xp.m_i;
    }
    iVar5 = RVar2.m_i - *(int *)(lVar1 + 0x264);
    bVar3 = QSplitter::opaqueResize
                      (*(QSplitter **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
    if (bVar3) {
      moveSplitter(this,iVar5);
    }
    else {
      this_01 = *(QSplitter **)(lVar1 + 600);
      iVar5 = closestLegalPosition(this,iVar5);
      QSplitter::setRubberBand(this_01,iVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterHandle::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (!d->pressed)
        return;

    const int pos = d->pick(parentWidget()->mapFromGlobal(e->globalPosition().toPoint()))
                    - d->mouseOffset;
    if (opaqueResize()) {
        moveSplitter(pos);
    } else {
        d->s->setRubberBand(closestLegalPosition(pos));
    }
}